

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O0

void __thiscall Js::GlobalObject::Initialize(GlobalObject *this,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  Type *pTVar3;
  JavascriptLibrary **ppJVar4;
  undefined4 *puVar5;
  Recycler *pRVar6;
  JavascriptLibrary *pJVar7;
  TrackAllocData local_50;
  JavascriptLibrary *local_28;
  JavascriptLibrary *localLibrary;
  Recycler *recycler;
  ScriptContext *scriptContext_local;
  GlobalObject *this_local;
  
  recycler = (Recycler *)scriptContext;
  scriptContext_local = (ScriptContext *)this;
  pTVar3 = Memory::WriteBarrierPtr<Js::Type>::operator->
                     (&(this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.type)
  ;
  ppJVar4 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptLibrary__
                      ((WriteBarrierPtr *)&pTVar3->javascriptLibrary);
  if (*ppJVar4 != (JavascriptLibrary *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x2f,"(type->javascriptLibrary == nullptr)",
                                "type->javascriptLibrary == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pRVar6 = ScriptContext::GetRecycler((ScriptContext *)recycler);
  localLibrary = (JavascriptLibrary *)pRVar6;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&JavascriptLibrary::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
             ,0x31);
  pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_50);
  pJVar7 = (JavascriptLibrary *)new<Memory::Recycler>(0x1de0,pRVar6,0x4642b0);
  JavascriptLibrary::JavascriptLibrary(pJVar7,this,(Recycler *)localLibrary);
  local_28 = pJVar7;
  ScriptContextBase::SetLibrary
            ((ScriptContextBase *)&recycler->collectionStateChangedObserver,pJVar7);
  pJVar7 = local_28;
  pTVar3 = Memory::WriteBarrierPtr<Js::Type>::operator->
                     (&(this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.type)
  ;
  Memory::WriteBarrierPtr<Js::JavascriptLibrary>::operator=(&pTVar3->javascriptLibrary,pJVar7);
  ScriptContext::InitializeCache((ScriptContext *)recycler);
  JavascriptLibrary::Initialize(local_28,(ScriptContext *)recycler,this);
  Memory::WriteBarrierPtr<Js::JavascriptLibrary>::operator=(&this->library,local_28);
  return;
}

Assistant:

void GlobalObject::Initialize(ScriptContext * scriptContext)
    {
        Assert(type->javascriptLibrary == nullptr);
        Recycler * recycler = scriptContext->GetRecycler();
        JavascriptLibrary* localLibrary = RecyclerNewFinalized(recycler, JavascriptLibrary, this, recycler);
        scriptContext->SetLibrary(localLibrary);
        type->javascriptLibrary = localLibrary;
        scriptContext->InitializeCache();
        localLibrary->Initialize(scriptContext, this);
        library = localLibrary;
    }